

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O3

void whisper_exp_compute_token_level_timestamps
               (whisper_context *ctx,whisper_state *state,int i_segment,float thold_pt,
               float thold_ptsum)

{
  ulong uVar1;
  int *piVar2;
  byte bVar3;
  long lVar4;
  pointer pfVar5;
  mapped_type *pmVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  pointer pwVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  float *pfVar23;
  int iVar24;
  long lVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  long *plVar30;
  float fVar31;
  float fVar32;
  int local_74;
  int64_t local_70;
  ulong local_68;
  long local_60;
  int64_t local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_68 = (ulong)((long)(state->energy).super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(state->energy).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
  if ((int)local_68 == 0) {
    whisper_log_internal
              (GGML_LOG_LEVEL_ERROR,"%s: no signal data available\n",
               "whisper_exp_compute_token_level_timestamps");
    return;
  }
  pwVar15 = (state->result_all).
            super__Vector_base<whisper_segment,_std::allocator<whisper_segment>_>._M_impl.
            super__Vector_impl_data._M_start + i_segment;
  lVar22 = *(long *)&(pwVar15->tokens).
                     super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>.
                     _M_impl.super__Vector_impl_data;
  local_60 = ((long)*(pointer *)
                     ((long)&(pwVar15->tokens).
                             super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                             ._M_impl + 8) - lVar22 >> 3) * 0x6db6db6db6db6db7;
  uVar21 = (uint)local_60;
  if (uVar21 != 0) {
    local_58 = pwVar15->t0;
    local_70 = pwVar15->t1;
    if (uVar21 == 1) {
      *(int64_t *)(lVar22 + 0x18) = local_58;
      *(int64_t *)(lVar22 + 0x20) = local_70;
    }
    else {
      if (0 < (int)uVar21) {
        uVar29 = 0;
        do {
          lVar22 = *(long *)&(pwVar15->tokens).
                             super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                             ._M_impl.super__Vector_impl_data;
          lVar25 = uVar29 * 0x38;
          piVar2 = (int *)(lVar22 + lVar25);
          iVar24 = (ctx->vocab).token_beg;
          local_74 = *(int *)(lVar22 + lVar25);
          if (uVar29 == 0) {
            if (local_74 == iVar24) {
              *(int64_t *)(piVar2 + 6) = local_58;
              *(int64_t *)(piVar2 + 8) = local_58;
              *(int64_t *)(lVar22 + 0x50) = local_58;
              state->t_beg = local_58;
              state->t_last = local_58;
              state->tid_last = iVar24;
              iVar24 = (ctx->vocab).token_beg;
              local_74 = *piVar2;
            }
            else {
              *(int64_t *)(piVar2 + 6) = state->t_last;
            }
          }
          lVar22 = ((long)piVar2[1] - (long)iVar24) * 2 + state->t_beg;
          pmVar6 = std::
                   map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::at(&(ctx->vocab).id_to_token,(key_type *)&local_74);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,(pmVar6->_M_dataplus)._M_p,(allocator<char> *)&local_74);
          fVar31 = 0.0;
          if (local_48 != 0) {
            lVar8 = 0;
            do {
              bVar3 = *(byte *)((long)local_50 + lVar8);
              if (bVar3 < 0x2c) {
                fVar32 = 0.01;
                if (bVar3 != 0x20) {
                  if (bVar3 != 0x21) goto LAB_0013a8d8;
                  goto LAB_0013a8d3;
                }
              }
              else if ((bVar3 == 0x3f) || (bVar3 == 0x2e)) {
LAB_0013a8d3:
                fVar32 = 3.0;
              }
              else if (bVar3 == 0x2c) {
                fVar32 = 2.0;
              }
              else {
LAB_0013a8d8:
                fVar32 = *(float *)(&DAT_0015a278 + (ulong)((byte)(bVar3 - 0x30) < 10) * 4);
              }
              fVar31 = fVar31 + fVar32;
              lVar8 = lVar8 + 1;
            } while (local_48 != lVar8);
          }
          *(float *)(*(long *)&(pwVar15->tokens).
                               super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                               ._M_impl.super__Vector_impl_data + 0x30 + lVar25) = fVar31;
          if (local_50 != local_40) {
            operator_delete(local_50,local_40[0] + 1);
          }
          if ((((thold_pt < (float)piVar2[4]) && (thold_ptsum < (float)piVar2[5])) &&
              (iVar24 = piVar2[1], state->tid_last < iVar24)) && (lVar22 <= local_70)) {
            lVar8 = *(long *)&(pwVar15->tokens).
                              super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                              ._M_impl.super__Vector_impl_data;
            if (uVar29 != 0) {
              *(long *)(lVar8 + -0x18 + lVar25) = lVar22;
            }
            *(long *)(lVar8 + 0x18 + lVar25) = lVar22;
            state->tid_last = iVar24;
          }
          uVar29 = uVar29 + 1;
        } while (uVar29 != (uVar21 & 0x7fffffff));
        lVar22 = *(long *)&(pwVar15->tokens).
                           super__Vector_base<whisper_token_data,_std::allocator<whisper_token_data>_>
                           ._M_impl.super__Vector_impl_data;
      }
      uVar21 = (uint)local_60;
      *(int64_t *)(lVar22 + 0x20 + (long)(int)(uVar21 - 2) * 0x38) = local_70;
      uVar16 = uVar21 - 1;
      lVar25 = (long)(int)uVar16 * 0x38;
      *(int64_t *)(lVar22 + 0x18 + lVar25) = local_70;
      *(int64_t *)(lVar22 + 0x20 + lVar25) = local_70;
      state->t_last = local_70;
      uVar20 = 0;
      do {
        iVar24 = -1;
        lVar25 = (long)(int)uVar20;
        uVar19 = uVar20;
        if ((int)uVar20 < (int)uVar21) {
          if (*(long *)(lVar22 + 0x20 + lVar25 * 0x38) < 0) {
            plVar30 = (long *)(lVar25 * 0x38 + lVar22 + 0x58);
            lVar8 = 0;
            do {
              if ((1 - (long)(int)uVar21) + lVar25 == lVar8) {
                bVar12 = true;
                uVar19 = uVar21;
                goto LAB_0013aa26;
              }
              lVar8 = lVar8 + -1;
              lVar4 = *plVar30;
              plVar30 = plVar30 + 7;
            } while (lVar4 < 0);
            bVar12 = (long)(int)uVar21 <= lVar25 - lVar8;
            uVar19 = uVar20 - (int)lVar8;
          }
          else {
            bVar12 = false;
          }
LAB_0013aa26:
          iVar24 = -(uint)bVar12;
        }
        iVar26 = uVar19 + iVar24;
        if (iVar26 - uVar20 != 0 && (int)uVar20 <= iVar26) {
          pfVar23 = (float *)(lVar22 + 0x30 + lVar25 * 0x38);
          iVar13 = (iVar26 - uVar20) + 1;
          fVar31 = 0.0;
          do {
            fVar31 = fVar31 + *pfVar23;
            pfVar23 = pfVar23 + 0xe;
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
          lVar8 = *(long *)(lVar22 + 0x20 + (long)iVar26 * 0x38);
          plVar30 = (long *)(lVar22 + lVar25 * 0x38 + 0x18);
          lVar4 = *plVar30;
          lVar25 = ((long)iVar24 + (long)(int)uVar19) - lVar25;
          do {
            lVar9 = (long)((*(float *)(plVar30 + 3) * (float)(lVar8 - lVar4)) / fVar31 +
                          (float)*plVar30);
            plVar30[1] = lVar9;
            plVar30[7] = lVar9;
            plVar30 = plVar30 + 7;
            lVar25 = lVar25 + -1;
          } while (lVar25 != 0);
        }
        uVar20 = iVar26 + 1;
      } while ((int)uVar20 < (int)uVar21);
      if (1 < (int)uVar21) {
        uVar29 = 0;
        plVar30 = (long *)(lVar22 + -0x18);
        do {
          lVar25 = plVar30[7];
          if (lVar25 < 0) {
            plVar30[0xd] = lVar25;
          }
          if ((uVar29 != 0) && (lVar8 = *plVar30, plVar30[6] < lVar8)) {
            plVar30[6] = lVar8;
            if (lVar25 < lVar8) {
              lVar25 = lVar8;
            }
            plVar30[7] = lVar25;
          }
          uVar29 = uVar29 + 1;
          plVar30 = plVar30 + 7;
        } while (uVar16 != uVar29);
      }
      if (0 < (int)uVar21) {
        uVar20 = (uint)local_68;
        uVar19 = uVar20 - 1;
        uVar29 = 0;
        do {
          lVar25 = uVar29 * 0x38;
          if (*(int *)(lVar22 + lVar25) < (ctx->vocab).token_eot) {
            lVar8 = lVar22 + lVar25;
            uVar27 = *(int *)(lVar8 + 0x18) * 0xa0;
            if ((int)uVar19 <= (int)uVar27) {
              uVar27 = uVar19;
            }
            uVar14 = 0;
            if (0 < (int)uVar27) {
              uVar14 = uVar27;
            }
            uVar28 = *(int *)(lVar8 + 0x20) * 0xa0;
            if ((int)uVar19 <= (int)uVar28) {
              uVar28 = uVar19;
            }
            uVar11 = 0;
            if (0 < (int)uVar28) {
              uVar11 = (ulong)uVar28;
            }
            uVar17 = 2000;
            if (2000 < (int)uVar27) {
              uVar17 = uVar27;
            }
            uVar7 = (int)uVar11 + 2000;
            if ((int)uVar20 <= (int)uVar7) {
              uVar7 = uVar20;
            }
            pfVar5 = (state->energy).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
            fVar31 = 0.0;
            iVar24 = uVar7 - (uVar17 - 2000);
            if (iVar24 != 0 && (int)(uVar17 - 2000) <= (int)uVar7) {
              uVar18 = (ulong)uVar17 - 2000;
              fVar31 = 0.0;
              do {
                fVar31 = fVar31 + pfVar5[uVar18];
                uVar18 = uVar18 + 1;
              } while (uVar7 != uVar18);
              fVar31 = fVar31 * 0.5;
            }
            fVar31 = fVar31 / (float)iVar24;
            uVar18 = (ulong)uVar14;
            if ((uVar29 == 0) || (pfVar5[uVar18] <= fVar31)) {
              do {
                uVar1 = uVar18 + 1;
                if ((long)(int)uVar28 <= (long)uVar18) break;
                pfVar23 = pfVar5 + uVar18;
                uVar18 = uVar1;
              } while (*pfVar23 <= fVar31 && fVar31 != *pfVar23);
              uVar28 = (int)uVar1 - 1;
              *(ulong *)(lVar8 + 0x18) = (ulong)uVar28 / 0xa0;
            }
            else {
              uVar28 = uVar14;
              if (0 < (int)uVar27) {
                do {
                  if (pfVar5[uVar18] <= fVar31) {
                    uVar28 = (uint)uVar18;
                    goto LAB_0013ac89;
                  }
                  bVar12 = 1 < (long)uVar18;
                  uVar18 = uVar18 - 1;
                } while (bVar12);
                uVar28 = 0;
              }
LAB_0013ac89:
              lVar10 = (long)((int)uVar28 / 0xa0);
              lVar4 = ((long *)(lVar22 + -0x18))[uVar29 * 7];
              lVar9 = lVar10;
              if (lVar10 < lVar4) {
                lVar9 = lVar4;
              }
              *(long *)(lVar8 + 0x18) = lVar9;
              if (lVar10 < lVar4) {
                uVar28 = uVar14;
              }
            }
            if (pfVar5[uVar11] <= fVar31) {
              do {
                uVar18 = uVar11 - 1;
                if ((long)uVar11 <= (long)(int)uVar28) break;
                pfVar23 = pfVar5 + uVar11;
                uVar11 = uVar18;
              } while (*pfVar23 <= fVar31 && fVar31 != *pfVar23);
              lVar25 = (long)(((int)uVar18 + 1) / 0xa0);
            }
            else {
              if ((int)uVar11 < (int)uVar19) {
                do {
                  if (pfVar5[uVar11] <= fVar31) {
                    uVar11 = uVar11 & 0xffffffff;
                    goto LAB_0013ad23;
                  }
                  uVar11 = uVar11 + 1;
                } while (uVar19 != uVar11);
                uVar11 = (ulong)uVar19;
              }
LAB_0013ad23:
              *(ulong *)(lVar8 + 0x20) = uVar11 / 0xa0;
              if (((long)(int)uVar16 <= (long)uVar29) ||
                 (lVar25 = *(long *)(lVar22 + 0x50 + lVar25), (long)(uVar11 / 0xa0) <= lVar25))
              goto LAB_0013ad4e;
            }
            *(long *)(lVar8 + 0x20) = lVar25;
          }
LAB_0013ad4e:
          uVar29 = uVar29 + 1;
        } while (uVar29 != (uVar21 & 0x7fffffff));
      }
    }
  }
  return;
}

Assistant:

static void whisper_exp_compute_token_level_timestamps(
        struct whisper_context & ctx,
          struct whisper_state & state,
                           int   i_segment,
                         float   thold_pt,
                         float   thold_ptsum) {
    auto & segment = state.result_all[i_segment];
    auto & tokens  = segment.tokens;

    const int n_samples = state.energy.size();

    if (n_samples == 0) {
        WHISPER_LOG_ERROR("%s: no signal data available\n", __func__);
        return;
    }

    const int64_t t0 = segment.t0;
    const int64_t t1 = segment.t1;

    const int n = tokens.size();

    if (n == 0) {
        return;
    }

    if (n == 1) {
        tokens[0].t0 = t0;
        tokens[0].t1 = t1;

        return;
    }

    auto & t_beg    = state.t_beg;
    auto & t_last   = state.t_last;
    auto & tid_last = state.tid_last;

    for (int j = 0; j < n; ++j) {
        auto & token = tokens[j];

        if (j == 0) {
            if (token.id == whisper_token_beg(&ctx)) {
                tokens[j    ].t0 = t0;
                tokens[j    ].t1 = t0;
                tokens[j + 1].t0 = t0;

                t_beg    = t0;
                t_last   = t0;
                tid_last = whisper_token_beg(&ctx);
            } else {
                tokens[j    ].t0 = t_last;
            }
        }

        const int64_t tt = t_beg + 2*(token.tid - whisper_token_beg(&ctx));

        tokens[j].id    = token.id;
        tokens[j].tid   = token.tid;
        tokens[j].p     = token.p;
        tokens[j].pt    = token.pt;
        tokens[j].ptsum = token.ptsum;

        tokens[j].vlen = voice_length(whisper_token_to_str(&ctx, token.id));

        if (token.pt > thold_pt && token.ptsum > thold_ptsum && token.tid > tid_last && tt <= t1) {
            if (j > 0) {
                tokens[j - 1].t1 = tt;
            }
            tokens[j].t0 = tt;
            tid_last = token.tid;
        }
    }

    tokens[n - 2].t1 = t1;
    tokens[n - 1].t0 = t1;
    tokens[n - 1].t1 = t1;

    t_last = t1;

    // find intervals of tokens with unknown timestamps
    // fill the timestamps by proportionally splitting the interval based on the token voice lengths
    {
        int p0 = 0;
        int p1 = 0;

        while (true) {
            while (p1 < n && tokens[p1].t1 < 0) {
                p1++;
            }

            if (p1 >= n) {
                p1--;
            }

            //printf("p0=%d p1=%d t0=%lld t1=%lld\n", p0, p1, tokens[p0].t0, tokens[p1].t1);

            if (p1 > p0) {
                double psum = 0.0;
                for (int j = p0; j <= p1; j++) {
                    psum += tokens[j].vlen;
                }

                //printf("analyzing %d - %d, psum = %f\n", p0, p1, psum);

                const double dt = tokens[p1].t1 - tokens[p0].t0;

                // split the time proportionally to the voice length
                for (int j = p0 + 1; j <= p1; j++) {
                    const double ct = tokens[j - 1].t0 + dt*tokens[j - 1].vlen/psum;

                    tokens[j - 1].t1 = ct;
                    tokens[j    ].t0 = ct;
                }
            }

            p1++;
            p0 = p1;
            if (p1 >= n) {
                break;
            }
        }
    }

    // fix up (just in case)
    for (int j = 0; j < n - 1; j++) {
        if (tokens[j].t1 < 0) {
            tokens[j + 1].t0 = tokens[j].t1;
        }

        if (j > 0) {
            if (tokens[j - 1].t1 > tokens[j].t0) {
                tokens[j].t0 = tokens[j - 1].t1;
                tokens[j].t1 = std::max(tokens[j].t0, tokens[j].t1);
            }
        }
    }

    // VAD
    // expand or contract tokens based on voice activity
    {
        const int hw = WHISPER_SAMPLE_RATE/8;

        for (int j = 0; j < n; j++) {
            if (tokens[j].id >= whisper_token_eot(&ctx)) {
                continue;
            }

            int s0 = timestamp_to_sample(tokens[j].t0, n_samples);
            int s1 = timestamp_to_sample(tokens[j].t1, n_samples);

            const int ss0 = std::max(s0 - hw, 0);
            const int ss1 = std::min(s1 + hw, n_samples);

            const int ns = ss1 - ss0;

            float sum = 0.0f;

            for (int k = ss0; k < ss1; k++) {
                sum += state.energy[k];
            }

            const float thold = 0.5*sum/ns;

            {
                int k = s0;
                if (state.energy[k] > thold && j > 0) {
                    while (k > 0 && state.energy[k] > thold) {
                        k--;
                    }
                    tokens[j].t0 = sample_to_timestamp(k);
                    if (tokens[j].t0 < tokens[j - 1].t1) {
                        tokens[j].t0 = tokens[j - 1].t1;
                    } else {
                        s0 = k;
                    }
                } else {
                    while (state.energy[k] < thold && k < s1) {
                        k++;
                    }
                    s0 = k;
                    tokens[j].t0 = sample_to_timestamp(k);
                }
            }

            {
                int k = s1;
                if (state.energy[k] > thold) {
                    while (k < n_samples - 1 && state.energy[k] > thold) {
                        k++;
                    }
                    tokens[j].t1 = sample_to_timestamp(k);
                    if (j < n - 1 && tokens[j].t1 > tokens[j + 1].t0) {
                        tokens[j].t1 = tokens[j + 1].t0;
                    } else {
                        s1 = k;
                    }
                } else {
                    while (state.energy[k] < thold && k > s0) {
                        k--;
                    }
                    s1 = k;
                    tokens[j].t1 = sample_to_timestamp(k);
                }
            }
        }
    }

    // fixed token expand (optional)
    //{
    //    const int t_expand = 0;

    //    for (int j = 0; j < n; j++) {
    //        if (j > 0) {
    //            tokens[j].t0 = std::max(0, (int) (tokens[j].t0 - t_expand));
    //        }
    //        if (j < n - 1) {
    //            tokens[j].t1 = tokens[j].t1 + t_expand;
    //        }
    //    }
    //}

    // debug info
    //for (int j = 0; j < n; ++j) {
    //    const auto & token = tokens[j];
    //    const auto tt = token.pt > thold_pt && token.ptsum > 0.01 ? whisper_token_to_str(&ctx, token.tid) : "[?]";
    //    printf("%s: %10s %6.3f %6.3f %6.3f %6.3f %5d %5d '%s'\n", __func__,
    //            tt, token.p, token.pt, token.ptsum, token.vlen, (int) token.t0, (int) token.t1, whisper_token_to_str(&ctx, token.id));

    //    if (tokens[j].id >= whisper_token_eot(&ctx)) {
    //        continue;
    //    }
    //}
}